

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O0

void __thiscall IntVar::IntVar(IntVar *this,int _min,int _max)

{
  bool bVar1;
  uint uVar2;
  int in_EDX;
  uint in_ESI;
  vec<IntVar_*> *in_RDI;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  IntVar ***pppIVar3;
  
  Var::Var((Var *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  *(undefined ***)in_RDI = &PTR_finished_0031b8d8;
  pppIVar3 = &in_RDI->data;
  uVar2 = vec<IntVar_*>::size(&engine.vars);
  *(uint *)pppIVar3 = uVar2;
  Tint::Tint((Tint *)((long)&in_RDI->data + 4),in_ESI);
  Tint::Tint((Tint *)(in_RDI + 1),in_EDX);
  in_RDI[1].cap = in_ESI;
  *(int *)&in_RDI[1].data = in_EDX;
  *(undefined4 *)((long)&in_RDI[1].data + 4) = 0;
  *(undefined1 *)&in_RDI[2].sz = 0;
  *(undefined1 *)((long)&in_RDI[2].sz + 1) = 1;
  *(undefined1 *)((long)&in_RDI[2].sz + 2) = 1;
  *(undefined1 *)((long)&in_RDI[2].sz + 3) = 1;
  in_RDI[2].data = (IntVar **)0x0;
  in_RDI[3].sz = 0;
  in_RDI[3].data = (IntVar **)0x0;
  *(undefined1 *)&in_RDI[4].cap = 0;
  pppIVar3 = &in_RDI[4].data;
  vec<IntVar::PropInfo>::vec((vec<IntVar::PropInfo> *)pppIVar3);
  *(undefined1 *)&in_RDI[5].data = 0;
  *(undefined4 *)((long)&in_RDI[5].data + 4) = 0xffffffff;
  vec<IntVar_*>::push(in_RDI,(IntVar **)pppIVar3);
  in_RDI[4].sz = 7;
  bVar1 = isFixed((IntVar *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (bVar1) {
    in_RDI[4].sz = in_RDI[4].sz | 8;
  }
  return;
}

Assistant:

IntVar::IntVar(int _min, int _max)
		: var_id(engine.vars.size()), min(_min), max(_max), min0(_min), max0(_max) {
	assert(min_limit <= min && min <= max && max <= max_limit);
	engine.vars.push(this);
	changes = EVENT_C | EVENT_L | EVENT_U;
	if (isFixed()) {
		changes |= EVENT_F;
	}
}